

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIO.cpp
# Opt level: O2

DNN_NUMERIC
tfs::localTest2d(Dnn *dnn,vector<double,_std::allocator<double>_> *data,
                vector<long,_std::allocator<long>_> *label)

{
  pointer plVar1;
  DNN_INTEGER *pDVar2;
  double *pdVar3;
  Matrix *pMVar4;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  uint ii;
  int iVar8;
  DNN_INTEGER *pDVar9;
  DNN_NUMERIC DVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  DnnTrainerAdaDelta trainer;
  
  DnnTrainerAdaDelta::DnnTrainerAdaDelta(&trainer,dnn);
  DnnTrainer::learningRate(&trainer.super_DnnTrainer,0.01);
  DnnTrainer::momentum(&trainer.super_DnnTrainer,0.1);
  DnnTrainer::batchSize(&trainer.super_DnnTrainer,10);
  DnnTrainer::l2Decay(&trainer.super_DnnTrainer,0.001);
  pMVar4 = DnnTrainer::getMatrixInput(&trainer.super_DnnTrainer);
  if (pMVar4 == (Matrix *)0x0) {
    report_problem("Error",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                   ,"localTest2d",0x75,"Unable to obtain input matrix.");
    dVar11 = 0.0;
  }
  else if ((data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start == (pointer)0x0) {
    report_problem("Error",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                   ,"localTest2d",0x7a,"Unable to obtain input data.");
    dVar11 = 0.0;
  }
  else {
    plVar1 = (label->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (plVar1 == (pointer)0x0) {
      report_problem("Error",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                     ,"localTest2d",0x7f,"Unable to obtain input labels.");
      dVar11 = 0.0;
    }
    else {
      pDVar2 = (label->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar5 = (long)pDVar2 - (long)plVar1;
      if (uVar5 == 0) {
        report_problem("Error",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                       ,"localTest2d",0x84,"Label data size < 1");
        dVar11 = 0.0;
      }
      else {
        lVar6 = (uVar5 >> 3) * 200;
        auVar12._8_4_ = (int)((ulong)lVar6 >> 0x20);
        auVar12._0_8_ = lVar6;
        auVar12._12_4_ = 0x45300000;
        iVar8 = 0;
        dVar13 = 0.0;
        do {
          for (; iVar8 != 200; iVar8 = iVar8 + 1) {
            pdVar7 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            for (pDVar9 = (label->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                          super__Vector_impl_data._M_start; pDVar9 < pDVar2; pDVar9 = pDVar9 + 1) {
              pdVar3 = pMVar4->m_data;
              *pdVar3 = *pdVar7;
              pdVar3[1] = pdVar7[1];
              DVar10 = DnnTrainer::train(&trainer.super_DnnTrainer,*pDVar9);
              pdVar7 = pdVar7 + 2;
              dVar13 = dVar13 + DVar10;
            }
          }
          dVar11 = dVar13 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
          dVar13 = 0.0;
          iVar8 = 0;
        } while (0.05 < dVar11);
      }
    }
  }
  DnnTrainerAdaDelta::~DnnTrainerAdaDelta(&trainer);
  return dVar11;
}

Assistant:

DNN_NUMERIC
    localTest2d( Dnn &dnn, std::vector< DNN_NUMERIC > &data, std::vector< DNN_INTEGER > &label ) {
        DnnTrainerAdaDelta trainer( &dnn );
        trainer.learningRate( 0.01  );
        trainer.momentum(     0.1   );
        trainer.batchSize(   10     );
        trainer.l2Decay(      0.001 );
        
        Matrix *input = trainer.getMatrixInput();       // get the input matrix: x,y pair Matrix( 1, 1, 2 )
        if( input == 0 ) {
            log_error( "Unable to obtain input matrix." );
            return 0.0;
        }
        const DNN_NUMERIC *dPtr = data.data();
        if( dPtr == 0 ) {
            log_error( "Unable to obtain input data." );
            return 0.0;
        }
        const DNN_INTEGER *lPtr = label.data();
        if( lPtr == 0 ) {
            log_error( "Unable to obtain input labels." );
            return 0.0;
        }
        const unsigned long DATA_COUNT = label.size();
        if( DATA_COUNT < 1 ) {
            log_error( "Label data size < 1" );
            return 0.0;
        }
        const DNN_INTEGER *ePtr = lPtr + DATA_COUNT;
        
        const unsigned int MAX_ITERATION = 200;
        const DNN_NUMERIC   TARGET_LOSS  = 0.05;
        unsigned long count = 0;
        DNN_NUMERIC average_loss = 0.0;
        do {
            count++;
            average_loss = 0.0;
            for( unsigned int ii = 0; ii < MAX_ITERATION; ii++ ) {
                dPtr = data.data();
                lPtr = label.data();
                
                while( lPtr < ePtr ) {
                    DNN_NUMERIC *inPtr = input->data();
                    *inPtr++ = *dPtr++;     // x
                    *inPtr   = *dPtr++;     // y
                    average_loss += trainer.train( *lPtr++ );
                }
            }
            average_loss /= DATA_COUNT * MAX_ITERATION;
        } while( average_loss > TARGET_LOSS );
//        log_info( "Average loss = %f/%f. Count = %lu", average_loss, TARGET_LOSS, count );
        return average_loss;
    }